

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

ExtensionInfo *
google::protobuf::internal::anon_unknown_59::FindRegisteredExtension
          (MessageLite *extendee,int number)

{
  EnumValidityFuncWithArg *pEVar1;
  EnumValidityFuncWithArg *pEVar2;
  EnumValidityFuncWithArg *pEVar3;
  MessageLite *pMVar4;
  uint uVar5;
  code cVar6;
  undefined1 *puVar7;
  anon_union_8_1_a8a14541_for_iterator_2 this;
  ulong uVar8;
  reference pEVar9;
  byte bVar10;
  TcParseTableBase *pTVar11;
  ulong uVar12;
  undefined1 (*pauVar13) [16];
  ushort uVar14;
  uint uVar15;
  uint64_t v_3;
  ulong uVar16;
  uintptr_t v_4;
  uint64_t v_7;
  ulong uVar17;
  uintptr_t v_8;
  anon_union_8_1_a8a14541_for_iterator_2 aVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  __m128i match;
  const_iterator it;
  iterator local_50;
  const_iterator local_40;
  code cVar24;
  code cVar26;
  code cVar27;
  code cVar28;
  
  this.slot_ = internal::(anonymous_namespace)::global_registry.slot_;
  if (internal::(anonymous_namespace)::global_registry.slot_ != (slot_type *)0x0) {
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
    ::AssertNotDebugCapacity
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                *)internal::(anonymous_namespace)::global_registry.slot_);
    if ((1 < *(ulong *)&(this.slot_)->number) &&
       (uVar12 = (((CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                    *)&(this.slot_)->message)->
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 ).super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.capacity_, uVar12 < 0x11)) {
      uVar8 = ((ulong)extendee ^ 0x1976508) * -0x234dd359734ecb13;
      uVar8 = ((uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28 |
               uVar8 << 0x38) ^ (ulong)extendee) * -0x234dd359734ecb13;
      uVar8 = (ulong)(uint)number ^
              (uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18
               | (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 |
               (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38);
      pauVar13 = (undefined1 (*) [16])((this.slot_)->field_6).enum_validity_check.func;
      pTVar11 = ((this.slot_)->field_6).message_info.tc_table;
      if (uVar12 < 0xf) {
        if (8 < uVar12) {
          __assert_fail("(cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\") && \"Try enabling sanitizers.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x78b,
                        "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = google::protobuf::internal::ExtensionInfo, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                       );
        }
        uVar12 = *(ulong *)(*pauVar13 + uVar12) & 0x8080808080808080;
        if (uVar12 != 0x8080808080808080) {
          uVar12 = uVar12 ^ 0x8080808080808080;
          do {
            uVar17 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
              }
            }
            uVar17 = (ulong)(((uint)(uVar17 >> 3) & 0x1fffffff) * 0x30);
            pMVar4 = *(MessageLite **)((long)pTVar11 + (uVar17 - 0x30));
            uVar15 = *(uint *)((long)pTVar11 + (uVar17 - 0x28));
            if (uVar15 == number && pMVar4 == extendee) {
              uVar17 = ((ulong)pMVar4 ^ 0x1976508) * -0x234dd359734ecb13;
              uVar17 = ((uVar17 >> 0x38 | (uVar17 & 0xff000000000000) >> 0x28 |
                         (uVar17 & 0xff0000000000) >> 0x18 | (uVar17 & 0xff00000000) >> 8 |
                         (uVar17 & 0xff000000) << 8 | (uVar17 & 0xff0000) << 0x18 |
                         (uVar17 & 0xff00) << 0x28 | uVar17 << 0x38) ^ (ulong)pMVar4) *
                       -0x234dd359734ecb13;
              if (uVar8 != ((uVar17 >> 0x38 | (uVar17 & 0xff000000000000) >> 0x28 |
                             (uVar17 & 0xff0000000000) >> 0x18 | (uVar17 & 0xff00000000) >> 8 |
                             (uVar17 & 0xff000000) << 8 | (uVar17 & 0xff0000) << 0x18 |
                             (uVar17 & 0xff00) << 0x28 | uVar17 << 0x38) ^ (ulong)uVar15)) {
LAB_00f8055e:
                __assert_fail("(!is_key_equal || is_hash_equal) && \"eq(k1, k2) must imply that hash(k1) == hash(k2). \" \"hash/eq functors are inconsistent.\""
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0xfbf,
                              "auto absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, google::protobuf::internal::(anonymous namespace)::ExtensionHasher, google::protobuf::internal::(anonymous namespace)::ExtensionEq, std::allocator<google::protobuf::internal::ExtensionInfo>>::AssertHashEqConsistent(const google::protobuf::internal::(anonymous namespace)::ExtensionInfoKey &)::(anonymous class)::operator()(const ctrl_t *, slot_type *) const [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, Hash = google::protobuf::internal::(anonymous namespace)::ExtensionHasher, Eq = google::protobuf::internal::(anonymous namespace)::ExtensionEq, Alloc = std::allocator<google::protobuf::internal::ExtensionInfo>]"
                             );
              }
            }
            uVar12 = uVar12 & uVar12 - 1;
          } while (uVar12 != 0);
        }
      }
      else {
        uVar12 = *(ulong *)&(this.slot_)->number >> 1;
        while( true ) {
          auVar22 = *pauVar13;
          uVar15 = (uint)(ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                                 (ushort)(byte)(auVar22[0xf] >> 7) << 0xf);
          if (uVar15 != 0xffff) {
            uVar15 = ~uVar15;
            do {
              uVar5 = 0;
              if (uVar15 != 0) {
                for (; (uVar15 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
                }
              }
              if ((char)(*pauVar13)[uVar5] < '\0') {
                __assert_fail("(IsFull(ctrl[i]) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0x79d,
                              "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = google::protobuf::internal::ExtensionInfo, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                             );
              }
              pMVar4 = *(MessageLite **)((long)&pTVar11->has_bits_offset + (ulong)(uVar5 * 0x30));
              if (*(uint *)(&pTVar11->fast_idx_mask + uVar5 * 0x30) == number && pMVar4 == extendee)
              {
                uVar17 = ((ulong)pMVar4 ^ 0x1976508) * -0x234dd359734ecb13;
                uVar17 = ((uVar17 >> 0x38 | (uVar17 & 0xff000000000000) >> 0x28 |
                           (uVar17 & 0xff0000000000) >> 0x18 | (uVar17 & 0xff00000000) >> 8 |
                           (uVar17 & 0xff000000) << 8 | (uVar17 & 0xff0000) << 0x18 |
                           (uVar17 & 0xff00) << 0x28 | uVar17 << 0x38) ^ (ulong)pMVar4) *
                         -0x234dd359734ecb13;
                if (uVar8 != ((uVar17 >> 0x38 | (uVar17 & 0xff000000000000) >> 0x28 |
                               (uVar17 & 0xff0000000000) >> 0x18 | (uVar17 & 0xff00000000) >> 8 |
                               (uVar17 & 0xff000000) << 8 | (uVar17 & 0xff0000) << 0x18 |
                               (uVar17 & 0xff00) << 0x28 | uVar17 << 0x38) ^
                             (ulong)*(uint *)(&pTVar11->fast_idx_mask + uVar5 * 0x30)))
                goto LAB_00f8055e;
              }
              uVar12 = uVar12 - 1;
              uVar14 = (ushort)(uVar15 - 1) & (ushort)uVar15;
              uVar15 = CONCAT22((short)(uVar15 - 1 >> 0x10),uVar14);
            } while (uVar14 != 0);
          }
          if (uVar12 == 0) break;
          pTVar11 = (TcParseTableBase *)&pTVar11[0xd].post_loop_handler;
          puVar7 = *pauVar13;
          pauVar13 = pauVar13 + 1;
          if (puVar7[0xf] == -1) {
            __assert_fail("((remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x7a5,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = google::protobuf::internal::ExtensionInfo, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                         );
          }
        }
      }
    }
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
    ::AssertNotDebugCapacity
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                *)this.slot_);
    pEVar2 = ((this.slot_)->field_6).enum_validity_check.func;
    uVar12 = (((CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                *)&(this.slot_)->message)->
             super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
             ).super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value
             .capacity_;
    if ((uVar12 + 1 & uVar12) != 0) {
      __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0x14c,
                    "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]"
                   );
    }
    uVar8 = ((ulong)extendee ^ 0x1976508) * -0x234dd359734ecb13;
    uVar8 = ((uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18
              | (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18
              | (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38) ^ (ulong)extendee) * -0x234dd359734ecb13;
    uVar8 = ((ulong)(uint)number ^
            (uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
             (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
             (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38)) * -0x234dd359734ecb13;
    uVar17 = ((uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18
               | (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 |
               (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38) >> 7 ^
             (ulong)pEVar2 >> 0xc) & uVar12;
    bVar10 = (byte)(uVar8 >> 0x38);
    local_50.ctrl_ = (ctrl_t *)(ulong)(bVar10 & 0x7f);
    auVar22 = ZEXT216(CONCAT11(bVar10,bVar10) & 0x7f7f);
    auVar22 = pshuflw(auVar22,auVar22,0);
    uVar8 = 0;
    aVar18 = this;
    do {
      pEVar1 = pEVar2 + uVar17;
      cVar6 = pEVar1[0xf];
      cVar24 = auVar22[0];
      auVar25[0] = -(cVar24 == *pEVar1);
      cVar26 = auVar22[1];
      auVar25[1] = -(cVar26 == pEVar1[1]);
      cVar27 = auVar22[2];
      auVar25[2] = -(cVar27 == pEVar1[2]);
      cVar28 = auVar22[3];
      auVar25[3] = -(cVar28 == pEVar1[3]);
      auVar25[4] = -(cVar24 == pEVar1[4]);
      auVar25[5] = -(cVar26 == pEVar1[5]);
      auVar25[6] = -(cVar27 == pEVar1[6]);
      auVar25[7] = -(cVar28 == pEVar1[7]);
      auVar25[8] = -(cVar24 == pEVar1[8]);
      auVar25[9] = -(cVar26 == pEVar1[9]);
      auVar25[10] = -(cVar27 == pEVar1[10]);
      auVar25[0xb] = -(cVar28 == pEVar1[0xb]);
      auVar25[0xc] = -(cVar24 == pEVar1[0xc]);
      auVar25[0xd] = -(cVar26 == pEVar1[0xd]);
      auVar25[0xe] = -(cVar27 == pEVar1[0xe]);
      auVar25[0xf] = -(cVar28 == cVar6);
      uVar14 = (ushort)(SUB161(auVar25 >> 7,0) & 1) | (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe | (ushort)(auVar25[0xf] >> 7) << 0xf;
      uVar15 = (uint)uVar14;
      bVar19 = uVar14 == 0;
      if (!bVar19) {
        pEVar3 = ((this.slot_)->field_6).enum_validity_check.func;
        pTVar11 = ((this.slot_)->field_6).message_info.tc_table;
        bVar19 = false;
        do {
          uVar5 = 0;
          if (uVar15 != 0) {
            for (; (uVar15 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
            }
          }
          uVar16 = uVar5 + uVar17 & uVar12;
          bVar20 = *(MessageLite **)(&pTVar11->has_bits_offset + uVar16 * 0x18) == extendee;
          bVar21 = *(int *)(&pTVar11->fast_idx_mask + uVar16 * 0x30) == number;
          if (bVar21 && bVar20) {
            if (pEVar3 == (EnumValidityFuncWithArg *)0x0) {
              __assert_fail("ctrl != nullptr",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x9ef,
                            "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, google::protobuf::internal::(anonymous namespace)::ExtensionHasher, google::protobuf::internal::(anonymous namespace)::ExtensionEq, std::allocator<google::protobuf::internal::ExtensionInfo>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, Hash = google::protobuf::internal::(anonymous namespace)::ExtensionHasher, Eq = google::protobuf::internal::(anonymous namespace)::ExtensionEq, Alloc = std::allocator<google::protobuf::internal::ExtensionInfo>]"
                           );
            }
            aVar18.slot_ = (slot_type *)(&pTVar11->has_bits_offset + uVar16 * 0x18);
            local_50.ctrl_ = (ctrl_t *)(pEVar3 + uVar16);
          }
          if (bVar21 && bVar20) break;
          uVar14 = (ushort)(uVar15 - 1) & (ushort)uVar15;
          uVar15 = CONCAT22((short)(uVar15 - 1 >> 0x10),uVar14);
          bVar19 = uVar14 == 0;
        } while (!bVar19);
      }
      if (bVar19) {
        auVar23[0] = -(*pEVar1 == (EnumValidityFuncWithArg)0x80);
        auVar23[1] = -(pEVar1[1] == (EnumValidityFuncWithArg)0x80);
        auVar23[2] = -(pEVar1[2] == (EnumValidityFuncWithArg)0x80);
        auVar23[3] = -(pEVar1[3] == (EnumValidityFuncWithArg)0x80);
        auVar23[4] = -(pEVar1[4] == (EnumValidityFuncWithArg)0x80);
        auVar23[5] = -(pEVar1[5] == (EnumValidityFuncWithArg)0x80);
        auVar23[6] = -(pEVar1[6] == (EnumValidityFuncWithArg)0x80);
        auVar23[7] = -(pEVar1[7] == (EnumValidityFuncWithArg)0x80);
        auVar23[8] = -(pEVar1[8] == (EnumValidityFuncWithArg)0x80);
        auVar23[9] = -(pEVar1[9] == (EnumValidityFuncWithArg)0x80);
        auVar23[10] = -(pEVar1[10] == (EnumValidityFuncWithArg)0x80);
        auVar23[0xb] = -(pEVar1[0xb] == (EnumValidityFuncWithArg)0x80);
        auVar23[0xc] = -(pEVar1[0xc] == (EnumValidityFuncWithArg)0x80);
        auVar23[0xd] = -(pEVar1[0xd] == (EnumValidityFuncWithArg)0x80);
        auVar23[0xe] = -(pEVar1[0xe] == (EnumValidityFuncWithArg)0x80);
        auVar23[0xf] = -(cVar6 == (code)0x80);
        if ((((((((((((((((auVar23 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar23 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar23 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar23 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar23 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar23 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar23 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar23 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar23 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar23 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar23 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar23 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar23 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar23 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar23 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            cVar6 == (code)0x80) {
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
          ::AssertNotDebugCapacity
                    ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                      *)this.slot_);
          local_50.ctrl_ = (ctrl_t *)0x0;
          goto LAB_00f8030f;
        }
        uVar16 = uVar8 + 0x10;
        if ((((CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
               *)&(this.slot_)->message)->
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            ).super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            capacity_ < uVar16) {
          __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xe37,
                        "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, google::protobuf::internal::(anonymous namespace)::ExtensionHasher, google::protobuf::internal::(anonymous namespace)::ExtensionEq, std::allocator<google::protobuf::internal::ExtensionInfo>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, Hash = google::protobuf::internal::(anonymous namespace)::ExtensionHasher, Eq = google::protobuf::internal::(anonymous namespace)::ExtensionEq, Alloc = std::allocator<google::protobuf::internal::ExtensionInfo>, K = google::protobuf::internal::(anonymous namespace)::ExtensionInfoKey]"
                       );
        }
        uVar17 = uVar17 + uVar8 + 0x10 & uVar12;
        bVar19 = true;
      }
      else {
LAB_00f8030f:
        bVar19 = false;
        uVar16 = uVar8;
      }
      uVar8 = uVar16;
    } while (bVar19);
    local_50.field_1 = aVar18;
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
    ::AssertNotDebugCapacity
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                *)internal::(anonymous_namespace)::global_registry.slot_);
    local_40.inner_.ctrl_ = (ctrl_t *)0x0;
    bVar19 = absl::lts_20250127::container_internal::operator==
                       ((const_iterator *)&local_50,&local_40);
    if (!bVar19) {
      pEVar9 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
               ::iterator::operator*(&local_50);
      return pEVar9;
    }
  }
  return (ExtensionInfo *)0x0;
}

Assistant:

const ExtensionInfo* FindRegisteredExtension(const MessageLite* extendee,
                                             int number) {
  if (!global_registry) return nullptr;

  ExtensionInfoKey info;
  info.message = extendee;
  info.number = number;

  auto it = global_registry->find(info);
  if (it == global_registry->end()) {
    return nullptr;
  } else {
    return &*it;
  }
}